

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O3

void cm_zlib_inflate_fast(z_streamp strm,uint start)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uInt uVar4;
  uint uVar5;
  internal_state *piVar6;
  byte *pbVar7;
  byte *pbVar8;
  ulg uVar9;
  Posf *pPVar10;
  ulg uVar11;
  uint uVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  byte *pbVar18;
  uint uVar19;
  uint uVar20;
  Posf *pPVar21;
  long lVar22;
  uint uVar23;
  byte *pbVar24;
  byte *pbVar25;
  byte *pbVar26;
  byte *pbVar27;
  ulong uVar28;
  int local_38;
  
  piVar6 = strm->state;
  pbVar18 = strm->next_in;
  pbVar25 = pbVar18 + (strm->avail_in - 5);
  pbVar7 = strm->next_out;
  uVar4 = strm->avail_out;
  local_38 = (int)pbVar7 - (start - uVar4);
  iVar16 = *(int *)((long)&piVar6->gzhead + 4);
  uVar11 = piVar6->gzindex;
  uVar5 = *(uint *)((long)&piVar6->gzindex + 4);
  pbVar8 = *(byte **)&piVar6->method;
  uVar28._0_4_ = piVar6->w_size;
  uVar28._4_4_ = piVar6->w_bits;
  bVar1 = *(byte *)&piVar6->head;
  bVar2 = *(byte *)((long)&piVar6->head + 4);
  uVar12 = piVar6->w_mask;
  uVar9 = piVar6->window_size;
  pPVar10 = piVar6->prev;
  pbVar26 = pbVar7;
LAB_00241607:
  if (uVar12 < 0xf) {
    bVar3 = *pbVar18;
    pbVar24 = pbVar18 + 1;
    pbVar18 = pbVar18 + 2;
    uVar28 = ((ulong)*pbVar24 << ((byte)uVar12 + 8 & 0x3f)) +
             ((ulong)bVar3 << ((byte)uVar12 & 0x3f)) + uVar28;
    uVar12 = uVar12 | 0x10;
  }
  pbVar24 = (byte *)((ulong)((uint)uVar28 & ~(-1 << (bVar1 & 0x1f))) * 4 + uVar9);
  while( true ) {
    uVar28 = uVar28 >> (pbVar24[1] & 0x3f);
    uVar12 = uVar12 - pbVar24[1];
    bVar3 = *pbVar24;
    if (bVar3 == 0) break;
    pbVar27 = pbVar26;
    if ((bVar3 & 0x10) != 0) {
      uVar19 = (uint)*(ushort *)(pbVar24 + 2);
      uVar15 = bVar3 & 0xf;
      if ((bVar3 & 0xf) != 0) {
        if (uVar12 < uVar15) {
          bVar3 = *pbVar18;
          pbVar18 = pbVar18 + 1;
          uVar28 = uVar28 + ((ulong)bVar3 << ((byte)uVar12 & 0x3f));
          uVar12 = uVar12 + 8;
        }
        uVar19 = (uint)*(ushort *)(pbVar24 + 2) + (~(-1 << (sbyte)uVar15) & (uint)uVar28);
        uVar28 = uVar28 >> (sbyte)uVar15;
        uVar12 = uVar12 - uVar15;
      }
      if (uVar12 < 0xf) {
        bVar3 = *pbVar18;
        pbVar24 = pbVar18 + 1;
        pbVar18 = pbVar18 + 2;
        uVar28 = ((ulong)*pbVar24 << ((byte)uVar12 + 8 & 0x3f)) +
                 ((ulong)bVar3 << ((byte)uVar12 & 0x3f)) + uVar28;
        uVar12 = uVar12 | 0x10;
      }
      pPVar21 = pPVar10 + (ulong)((uint)uVar28 & ~(-1 << (bVar2 & 0x1f))) * 2;
      uVar28 = uVar28 >> (*(byte *)((long)pPVar21 + 1) & 0x3f);
      uVar12 = uVar12 - *(byte *)((long)pPVar21 + 1);
      bVar3 = (byte)*pPVar21;
      goto LAB_00241721;
    }
    if ((bVar3 & 0x40) != 0) {
      iVar16 = 0x3f3f;
      if ((bVar3 & 0x20) != 0) goto LAB_00241a01;
      pcVar14 = "invalid literal/length code";
      goto LAB_002419f8;
    }
    pbVar24 = (byte *)((ulong)*(ushort *)(pbVar24 + 2) * 4 + uVar9 +
                      (ulong)(~(-1 << (bVar3 & 0x1f)) & (uint)uVar28) * 4);
  }
  *pbVar26 = pbVar24[2];
  goto LAB_00241681;
LAB_00241721:
  if ((bVar3 & 0x10) != 0) goto LAB_00241760;
  if ((bVar3 & 0x40) != 0) {
    pcVar14 = "invalid distance code";
    goto LAB_002419f8;
  }
  pPVar21 = pPVar10 + (ulong)pPVar21[1] * 2 + (ulong)(~(-1 << (bVar3 & 0x1f)) & (uint)uVar28) * 2;
  uVar28 = uVar28 >> (*(byte *)((long)pPVar21 + 1) & 0x3f);
  uVar12 = uVar12 - *(byte *)((long)pPVar21 + 1);
  bVar3 = (byte)*pPVar21;
  goto LAB_00241721;
LAB_00241760:
  uVar15 = bVar3 & 0xf;
  if (uVar12 < uVar15) {
    uVar28 = ((ulong)*pbVar18 << ((byte)uVar12 & 0x3f)) + uVar28;
    uVar20 = uVar12 + 8;
    if (uVar20 < uVar15) {
      pbVar24 = pbVar18 + 1;
      pbVar18 = pbVar18 + 2;
      uVar28 = uVar28 + ((ulong)*pbVar24 << ((byte)uVar20 & 0x3f));
      uVar12 = uVar12 + 0x10;
    }
    else {
      pbVar18 = pbVar18 + 1;
      uVar12 = uVar20;
    }
  }
  uVar23 = (~(-1 << (sbyte)uVar15) & (uint)uVar28) + (uint)pPVar21[1];
  uVar28 = uVar28 >> (sbyte)uVar15;
  uVar12 = uVar12 - uVar15;
  uVar15 = (int)pbVar26 - local_38;
  uVar20 = uVar23 - uVar15;
  if (uVar23 < uVar15 || uVar20 == 0) {
    uVar13 = (ulong)uVar23;
    lVar22 = 0;
    uVar15 = uVar19;
    do {
      lVar17 = lVar22;
      pbVar26[lVar17] = pbVar26[lVar17 - uVar13];
      pbVar26[lVar17 + 1] = pbVar26[lVar17 + (1 - uVar13)];
      pbVar26[lVar17 + 2] = pbVar26[lVar17 + (2 - uVar13)];
      uVar15 = uVar15 - 3;
      lVar22 = lVar17 + 3;
    } while (2 < uVar15);
    if ((uint)lVar22 == uVar19) {
      pbVar27 = pbVar26 + lVar22;
    }
    else {
      pbVar26[lVar22] = pbVar26[lVar22 + -uVar13];
      if ((uint)lVar22 - uVar19 == -2) {
        pbVar27 = pbVar26 + lVar17 + 5;
        pbVar26[lVar17 + 4] = pbVar26[-uVar13 + 1 + lVar22];
      }
      else {
        pbVar27 = pbVar26 + lVar17 + 4;
      }
    }
    goto LAB_00241684;
  }
  if (((uint)uVar11 < uVar20) && (piVar6[1].dyn_ltree[0xf5] != (ct_data_s)0x0)) {
    pcVar14 = "invalid distance too far back";
LAB_002419f8:
    strm->msg = pcVar14;
    iVar16 = 0x3f51;
LAB_00241a01:
    piVar6->status = iVar16;
LAB_00241a05:
    strm->next_in = pbVar18 + -(ulong)(uVar12 >> 3);
    strm->next_out = pbVar27;
    strm->avail_in = ((int)pbVar25 - (int)(pbVar18 + -(ulong)(uVar12 >> 3))) + 5;
    uVar28 = (ulong)((uint)uVar28 & ~(-1 << (sbyte)(uVar12 & 7)));
    strm->avail_out = ((int)(pbVar7 + (uVar4 - 0x101)) - (int)pbVar27) + 0x101;
    piVar6->w_size = (int)uVar28;
    piVar6->w_bits = (int)(uVar28 >> 0x20);
    piVar6->w_mask = uVar12 & 7;
    return;
  }
  if (uVar5 == 0) {
    pbVar24 = pbVar8 + (iVar16 - uVar20);
    uVar15 = uVar19 - uVar20;
    if (uVar20 <= uVar19 && uVar15 != 0) {
      lVar22 = 0;
      do {
        *pbVar26 = pbVar24[lVar22];
        pbVar26 = pbVar26 + 1;
        lVar22 = lVar22 + 1;
      } while (uVar20 != (uint)lVar22);
LAB_00241949:
      pbVar24 = pbVar26 + -(ulong)uVar23;
      pbVar27 = pbVar26;
      uVar19 = uVar15;
    }
  }
  else if (uVar5 < uVar20) {
    pbVar24 = pbVar8 + ((uVar5 + iVar16) - uVar20);
    uVar20 = uVar20 - uVar5;
    uVar15 = uVar19 - uVar20;
    if (uVar20 <= uVar19 && uVar15 != 0) {
      lVar22 = 0;
      do {
        pbVar26[lVar22] = pbVar24[lVar22];
        lVar22 = lVar22 + 1;
      } while (uVar20 != (uint)lVar22);
      pbVar26 = pbVar26 + lVar22;
      pbVar24 = pbVar8;
      pbVar27 = pbVar26;
      uVar19 = uVar15;
      if (uVar5 < uVar15) {
        lVar22 = 0;
        do {
          *pbVar26 = pbVar8[lVar22];
          pbVar26 = pbVar26 + 1;
          lVar22 = lVar22 + 1;
        } while (uVar5 != (uint)lVar22);
        uVar15 = uVar15 - uVar5;
        goto LAB_00241949;
      }
    }
  }
  else {
    pbVar24 = pbVar8 + (uVar5 - uVar20);
    uVar15 = uVar19 - uVar20;
    if (uVar20 <= uVar19 && uVar15 != 0) {
      lVar22 = 0;
      do {
        *pbVar26 = pbVar24[lVar22];
        pbVar26 = pbVar26 + 1;
        lVar22 = lVar22 + 1;
      } while (uVar20 != (uint)lVar22);
      goto LAB_00241949;
    }
  }
  for (; 2 < uVar19; uVar19 = uVar19 - 3) {
    *pbVar27 = *pbVar24;
    pbVar27[1] = pbVar24[1];
    pbVar27[2] = pbVar24[2];
    pbVar24 = pbVar24 + 3;
    pbVar27 = pbVar27 + 3;
  }
  if (uVar19 != 0) {
    *pbVar27 = *pbVar24;
    pbVar26 = pbVar27;
    if (uVar19 == 2) {
      pbVar27[1] = pbVar24[1];
      pbVar27 = pbVar27 + 2;
    }
    else {
LAB_00241681:
      pbVar27 = pbVar26 + 1;
    }
  }
LAB_00241684:
  if ((pbVar25 <= pbVar18) || (pbVar26 = pbVar27, pbVar7 + (uVar4 - 0x101) <= pbVar27))
  goto LAB_00241a05;
  goto LAB_00241607;
}

Assistant:

void ZLIB_INTERNAL inflate_fast(z_streamp strm, unsigned start) {
    struct inflate_state FAR *state;
    z_const unsigned char FAR *in;      /* local strm->next_in */
    z_const unsigned char FAR *last;    /* have enough input while in < last */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned wnext;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code const *here;           /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in;
    last = in + (strm->avail_in - 5);
    out = strm->next_out;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    wnext = state->wnext;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
            hold += (unsigned long)(*in++) << bits;
            bits += 8;
        }
        here = lcode + (hold & lmask);
      dolen:
        op = (unsigned)(here->bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(here->op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, here->val >= 0x20 && here->val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", here->val));
            *out++ = (unsigned char)(here->val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(here->val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
                hold += (unsigned long)(*in++) << bits;
                bits += 8;
            }
            here = dcode + (hold & dmask);
          dodist:
            op = (unsigned)(here->bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(here->op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(here->val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(*in++) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(*in++) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        if (state->sane) {
                            strm->msg =
                                (char *)"invalid distance too far back";
                            state->mode = BAD;
                            break;
                        }
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
                        if (len <= op - whave) {
                            do {
                                *out++ = 0;
                            } while (--len);
                            continue;
                        }
                        len -= op - whave;
                        do {
                            *out++ = 0;
                        } while (--op > whave);
                        if (op == 0) {
                            from = out - dist;
                            do {
                                *out++ = *from++;
                            } while (--len);
                            continue;
                        }
#endif
                    }
                    from = window;
                    if (wnext == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (wnext < op) {      /* wrap around window */
                        from += wsize + wnext - op;
                        op -= wnext;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = window;
                            if (wnext < len) {  /* some from start of window */
                                op = wnext;
                                len -= op;
                                do {
                                    *out++ = *from++;
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += wnext - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                *out++ = *from++;
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    }
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        *out++ = *from++;
                        *out++ = *from++;
                        *out++ = *from++;
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        *out++ = *from++;
                        if (len > 1)
                            *out++ = *from++;
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                here = dcode + here->val + (hold & ((1U << op) - 1));
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            here = lcode + here->val + (hold & ((1U << op) - 1));
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in;
    strm->next_out = out;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}